

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

char * oonf_layer2_neigh_key_to_string
                 (oonf_layer2_neigh_key_str *buf,oonf_layer2_neigh_key *key,_Bool show_mac)

{
  uint8_t uVar1;
  size_t sVar2;
  size_t sStack_48;
  uint8_t af;
  size_t str_idx;
  _Bool show_mac_local;
  oonf_layer2_neigh_key *key_local;
  oonf_layer2_neigh_key_str *buf_local;
  
  if (key == (oonf_layer2_neigh_key *)0x0) {
    buf_local = (oonf_layer2_neigh_key_str *)oonf_layer2_neigh_key_to_string::NONE;
  }
  else {
    uVar1 = (key->addr)._type;
    if ((uVar1 == '/') || (uVar1 == '0')) {
      if (show_mac) {
        netaddr_to_prefixstring(buf,key,0);
      }
      else {
        (buf->nbuf).buf[0] = '\0';
      }
      buf_local = buf;
      if (key->link_id_length != '\0') {
        sVar2 = strlen(buf->buf);
        sStack_48 = sVar2;
        if (show_mac) {
          sStack_48 = sVar2 + 1;
          buf->buf[sVar2] = ',';
        }
        strhex_from_bin((long)buf + sStack_48,99 - sStack_48,key->link_id,key->link_id_length);
      }
    }
    else {
      buf_local = (oonf_layer2_neigh_key_str *)oonf_layer2_neigh_key_to_string::NONE;
    }
  }
  return (char *)buf_local;
}

Assistant:

const char *
oonf_layer2_neigh_key_to_string(union oonf_layer2_neigh_key_str *buf,
    const struct oonf_layer2_neigh_key *key, bool show_mac) {
  static const char NONE[] = "-";
  size_t str_idx;
  uint8_t af;

  if (key == NULL) {
    return NONE;
  }

  af = netaddr_get_address_family(&key->addr);
  if (af != AF_MAC48 && af != AF_EUI64) {
    return NONE;
  }

  if (show_mac) {
    netaddr_to_string(&buf->nbuf, &key->addr);
  }
  else {
    buf->buf[0] = 0;
  }

  if (key->link_id_length == 0) {
    return buf->buf;
  }

  str_idx = strlen(buf->buf);

  if (show_mac) {
    buf->buf[str_idx++] = ',';
  }

  strhex_from_bin(&buf->buf[str_idx], sizeof(*buf) - str_idx, key->link_id, key->link_id_length);
  return buf->buf;
}